

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O0

void __thiscall CMud::LoadGreetingScreen(CMud *this)

{
  char *pcVar1;
  char *in_RDI;
  int i;
  char buf [4096];
  char tempbuf [210];
  FILE *fp;
  undefined4 in_stack_ffffffffffffef10;
  int iVar2;
  char local_10e8 [32];
  char *in_stack_ffffffffffffef38;
  char local_e8 [216];
  FILE *local_10;
  
  local_10 = fopen("../configs/login_banner.txt","r");
  local_10e8[0] = '\0';
  while( true ) {
    pcVar1 = fgets(local_e8,200,local_10);
    if (pcVar1 == (char *)0x0) break;
    strcat(local_10e8,local_e8);
    strcat(local_10e8,"\r");
  }
  for (iVar2 = 0; local_10e8[iVar2] != '\0'; iVar2 = iVar2 + 1) {
  }
  local_10e8[iVar2 + -2] = '\0';
  fclose(local_10);
  RString::operator=((RString *)CONCAT44(iVar2,in_stack_ffffffffffffef10),in_RDI);
  help_greeting = palloc_string(in_stack_ffffffffffffef38);
  return;
}

Assistant:

void CMud::LoadGreetingScreen()
{
	//can't use cfile because of weird \r action
	FILE *fp = fopen(LOGIN_BANNER_FILE, "r");
	char tempbuf[210], buf[4096];
	int i;
	buf[0] = '\0';
	while(fgets(tempbuf,200,fp))
 	{	
		strcat(buf,tempbuf);
       	strcat(buf,"\r");
    }
	for(i=0; buf[i] != '\0'; i++)
		;
	buf[i-2] = '\0';
   	fclose(fp);
	greeting_screen = buf;
	help_greeting = palloc_string(buf);
}